

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  FileReaderFactory defaultFactory;
  allocator<char> local_1b6;
  allocator<char> local_1b5;
  EssenceType_t EssenceType;
  undefined1 local_1b0 [136];
  Result_t result;
  char *local_120;
  CommandOptions Options;
  IFileReaderFactory local_30 [4];
  
  CommandOptions::CommandOptions(&Options,argc,argv);
  if (Options.version_flag == true) {
    banner(_stdout);
  }
  if (Options.help_flag == true) {
    usage(_stdout);
  }
  iVar1 = 0;
  if ((Options.version_flag != false) || (Options.help_flag != false)) goto LAB_0010ac32;
  if (Options.error_flag == true) {
    fprintf(_stderr,"There was a problem. Type %s -h for help.\n","as-02-unwrap");
    iVar1 = 3;
    goto LAB_0010ac32;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,Options.input_filename,(allocator<char> *)(local_1b0 + 0x68));
  ASDCP::EssenceType((string *)&result,(EssenceType_t *)local_1b0,(IFileReaderFactory *)&EssenceType
                    );
  std::__cxx11::string::~string((string *)local_1b0);
  if ((int)_result < 0) {
LAB_0010ac4c:
    fputs("Program stopped on error.\n",_stderr);
    iVar1 = 1;
    if (_result != Kumu::RESULT_FAIL) {
      fputs(local_120,_stderr);
      fputc(10,_stderr);
    }
  }
  else {
    switch(EssenceType) {
    case ESS_AS02_JPEG_2000:
      read_JP2K_file((CommandOptions *)local_1b0,(IFileReaderFactory *)&Options);
      Kumu::Result_t::operator=(&result,(Result_t *)local_1b0);
      break;
    case ESS_AS02_PCM_24b_48k:
    case ESS_AS02_PCM_24b_96k:
      read_PCM_file((CommandOptions *)local_1b0,(IFileReaderFactory *)&Options);
      Kumu::Result_t::operator=(&result,(Result_t *)local_1b0);
      break;
    case ESS_AS02_TIMED_TEXT:
      read_timed_text_file((CommandOptions *)local_1b0,(IFileReaderFactory *)&Options);
      Kumu::Result_t::operator=(&result,(Result_t *)local_1b0);
      break;
    case ESS_AS02_ISXD:
      if (Options.g_stream_sid == 0) {
        read_isxd_file((CommandOptions *)local_1b0,(IFileReaderFactory *)&Options);
        Kumu::Result_t::operator=(&result,(Result_t *)local_1b0);
        break;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_1b0 + 0x68),Options.input_filename,&local_1b5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_30,Options.file_prefix,&local_1b6);
      extract_generic_stream_partition_payload
                ((string *)local_1b0,(int)local_1b0 + 0x68,
                 (string *)(ulong)(uint)Options.g_stream_sid,local_30);
      Kumu::Result_t::operator=(&result,(Result_t *)local_1b0);
      Kumu::Result_t::~Result_t((Result_t *)local_1b0);
      std::__cxx11::string::~string((string *)local_30);
      std::__cxx11::string::~string((string *)(local_1b0 + 0x68));
      goto LAB_0010ac19;
    case ESS_AS02_ACES:
      read_ACES_file((CommandOptions *)local_1b0,(IFileReaderFactory *)&Options);
      Kumu::Result_t::operator=(&result,(Result_t *)local_1b0);
      break;
    case ESS_AS02_IAB:
      read_iab_file((CommandOptions *)local_1b0,(IFileReaderFactory *)&Options);
      Kumu::Result_t::operator=(&result,(Result_t *)local_1b0);
      break;
    default:
      fprintf(_stderr,"%s: Unknown file type (%d), not AS-02 essence.\n",Options.input_filename);
      iVar1 = 5;
      goto LAB_0010ac25;
    }
    Kumu::Result_t::~Result_t((Result_t *)local_1b0);
LAB_0010ac19:
    iVar1 = 0;
    if ((int)_result < 0) goto LAB_0010ac4c;
  }
LAB_0010ac25:
  Kumu::Result_t::~Result_t(&result);
LAB_0010ac32:
  std::__cxx11::string::~string((string *)&Options.prefix_buffer);
  return iVar1;
}

Assistant:

int
main(int argc, const char** argv)
{
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  EssenceType_t EssenceType;
  Kumu::FileReaderFactory defaultFactory;
  Result_t result = ASDCP::EssenceType(Options.input_filename, EssenceType, defaultFactory);

  if ( ASDCP_SUCCESS(result) )
    {
      switch ( EssenceType )
	{
	case ESS_AS02_JPEG_2000:
	  result = read_JP2K_file(Options, defaultFactory);
	  break;
	//PB
	case ESS_AS02_ACES:
	  result = read_ACES_file(Options, defaultFactory);
	  break;
	//--
	case ESS_AS02_PCM_24b_48k:
	case ESS_AS02_PCM_24b_96k:
	  result = read_PCM_file(Options, defaultFactory);
	  break;

	case ESS_AS02_TIMED_TEXT:
	  result = read_timed_text_file(Options, defaultFactory);
	  break;

    case ESS_AS02_IAB:
	  result = read_iab_file(Options, defaultFactory);
	  break;

	case ESS_AS02_ISXD:
	  if ( Options.g_stream_sid == 0 )
	    {
          result = read_isxd_file(Options, defaultFactory);
	    }
	  else
	    {
	      result = extract_generic_stream_partition_payload(Options.input_filename,
								Options.g_stream_sid,
                                Options.file_prefix, defaultFactory);
	    }
	  break;

	default:
	  fprintf(stderr, "%s: Unknown file type (%d), not AS-02 essence.\n", Options.input_filename, EssenceType);
	  return 5;
	}
    }

  if ( ASDCP_FAILURE(result) )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}